

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O2

void __thiscall
gmlc::concurrency::DelayedDestructor<helics::Broker>::addObjectsToBeDestroyed
          (DelayedDestructor<helics::Broker> *this,shared_ptr<helics::Broker> *obj)

{
  std::timed_mutex::lock(&this->destructionLock);
  std::vector<std::shared_ptr<helics::Broker>,std::allocator<std::shared_ptr<helics::Broker>>>::
  emplace_back<std::shared_ptr<helics::Broker>>
            ((vector<std::shared_ptr<helics::Broker>,std::allocator<std::shared_ptr<helics::Broker>>>
              *)&this->ElementsToBeDestroyed,obj);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void addObjectsToBeDestroyed(std::shared_ptr<X> obj)
    {
        std::lock_guard<std::timed_mutex> lock(destructionLock);
        ElementsToBeDestroyed.push_back(std::move(obj));
    }